

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O3

BN * __thiscall
BN::expLeftToRightK_aryMod
          (BN *__return_storage_ptr__,BN *this,BN *exponent,BN *mod,
          vector<BN,_std::allocator<BN>_> *g)

{
  pointer puVar1;
  bool bVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong local_88;
  BN local_70;
  BN local_58;
  vector<BN,_std::allocator<BN>_> *local_40;
  ulong local_38;
  
  puVar1 = (exponent->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_40 = g;
  if (((ulong)((long)(exponent->ba).
                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)puVar1) < 3) && (*puVar1 == 0)) {
    bn1();
  }
  else {
    bn1();
    uVar5 = (int)((ulong)((long)(exponent->ba).
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(exponent->ba).
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 1) - 1;
    if (-1 < (int)uVar5) {
      local_88 = (ulong)uVar5;
      do {
        uVar8 = 1;
        do {
          uVar3 = (exponent->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_88] >>
                  ((char)uVar8 * '\b' & 0x1fU);
          uVar6 = uVar3 & 0xff;
          uVar7 = 0;
          uVar5 = uVar6;
          if ((uVar3 & 1) == 0 && (char)uVar3 != '\0') {
            do {
              uVar6 = uVar5 >> 1;
              uVar7 = uVar7 + 1;
              uVar4 = uVar5 & 2;
              uVar5 = uVar6;
            } while (uVar4 == 0);
            if (uVar7 < 8) goto LAB_0010afcd;
          }
          else {
LAB_0010afcd:
            uVar9 = 8;
            local_38 = uVar8;
            do {
              Qrt(&local_70,__return_storage_ptr__);
              operator%(&local_58,&local_70,mod);
              if (&local_58 != __return_storage_ptr__) {
                std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator=
                          (&__return_storage_ptr__->ba,&local_58.ba);
              }
              if (local_58.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_58.ba.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_70.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_70.ba.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              uVar9 = uVar9 - 1;
              uVar8 = local_38;
            } while (uVar7 != uVar9);
          }
          karatsubaMultiplication
                    (&local_70,__return_storage_ptr__,
                     (BN *)((long)&(((local_40->super__Vector_base<BN,_std::allocator<BN>_>)._M_impl
                                     .super__Vector_impl_data._M_start)->ba).
                                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                   ._M_impl + (ulong)(uVar6 * 0x18)));
          operator%(&local_58,&local_70,mod);
          if (&local_58 != __return_storage_ptr__) {
            std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator=
                      (&__return_storage_ptr__->ba,&local_58.ba);
          }
          if (local_58.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_58.ba.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_70.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_70.ba.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          for (; uVar7 != 0; uVar7 = uVar7 - 1) {
            Qrt(&local_70,__return_storage_ptr__);
            operator%(&local_58,&local_70,mod);
            if (&local_58 != __return_storage_ptr__) {
              std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator=
                        (&__return_storage_ptr__->ba,&local_58.ba);
            }
            if (local_58.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_58.ba.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_70.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_70.ba.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
          }
          uVar8 = uVar8 - 1;
        } while (uVar8 < 2);
        bVar2 = 0 < (long)local_88;
        local_88 = local_88 - 1;
      } while (bVar2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BN BN::expLeftToRightK_aryMod(const BN& exponent, const BN& mod, const vector<BN>& g) const {
    if(exponent.is0())
        return BN::bn1();

    BN A(BN::bn1());
    for(int i = exponent.ba.size() - 1; i >= 0; i--) {
        for (size_t b = bz - 1; b < bz; --b) {
            bt ei = (exponent.ba[i] >> KaryBits * b) & KaryMask;

            size_t hi = 0;
            if(ei != 0) {
                while(! (ei & 1)) {
                    ei >>= 1;
                    hi++;
                }
            }

            for(size_t k = 0; k + hi < KaryBits; k++)
                A = A.Qrt() % mod;
            A = A * g[ei] % mod;
            for(size_t k = 0; k < hi; k++)
                A = A.Qrt() % mod;
        }
    }
    return A;

}